

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama.cpp
# Opt level: O1

char * llama_print_system_info(void)

{
  long lVar1;
  undefined8 uVar2;
  code *pcVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (llama_print_system_info::s_abi_cxx11_ == '\0') {
    llama_print_system_info_cold_1();
  }
  llama_print_system_info::s_abi_cxx11_._M_string_length = 0;
  *llama_print_system_info::s_abi_cxx11_._M_dataplus._M_p = '\0';
  lVar1 = ggml_backend_reg_count();
  if (lVar1 != 0) {
    uVar6 = 0;
    do {
      uVar2 = ggml_backend_reg_get(uVar6);
      pcVar3 = (code *)ggml_backend_reg_get_proc_address(uVar2,"ggml_backend_get_features");
      if (pcVar3 != (code *)0x0) {
        plVar4 = (long *)(*pcVar3)(uVar2);
        ggml_backend_reg_name(uVar2);
        std::__cxx11::string::append((char *)&llama_print_system_info::s_abi_cxx11_);
        std::__cxx11::string::append((char *)&llama_print_system_info::s_abi_cxx11_);
        lVar1 = *plVar4;
        while (lVar1 != 0) {
          plVar4 = plVar4 + 2;
          std::__cxx11::string::append((char *)&llama_print_system_info::s_abi_cxx11_);
          std::__cxx11::string::append((char *)&llama_print_system_info::s_abi_cxx11_);
          std::__cxx11::string::append((char *)&llama_print_system_info::s_abi_cxx11_);
          std::__cxx11::string::append((char *)&llama_print_system_info::s_abi_cxx11_);
          lVar1 = *plVar4;
        }
      }
      uVar6 = uVar6 + 1;
      uVar5 = ggml_backend_reg_count();
    } while (uVar6 < uVar5);
  }
  return llama_print_system_info::s_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char * llama_print_system_info(void) {
    static std::string s;
    s.clear(); // Clear the string, since it's static, otherwise it will accumulate data from previous calls.

    for (size_t i = 0; i < ggml_backend_reg_count(); i++) {
        auto * reg = ggml_backend_reg_get(i);
        auto * get_features_fn = (ggml_backend_get_features_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_get_features");
        if (get_features_fn) {
            ggml_backend_feature * features = get_features_fn(reg);
            s += ggml_backend_reg_name(reg);
            s += " : ";
            for (; features->name; features++) {
                s += features->name;
                s += " = ";
                s += features->value;
                s += " | ";
            }
        }
    }

    return s.c_str();
}